

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O0

void __thiscall
TrodesMsg::TrodesMsg<char_const*,std::__cxx11::string,unsigned_int>
          (TrodesMsg *this,string *f,char *head,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,uint tail_1)

{
  string *in_RCX;
  string *in_RSI;
  string *in_stack_00000098;
  TrodesMsg *in_stack_000000a0;
  string local_78 [8];
  TrodesMsg *in_stack_ffffffffffffff90;
  string local_48 [72];
  
  TrodesMsg(in_stack_ffffffffffffff90);
  std::__cxx11::string::string(local_48,in_RSI);
  std::__cxx11::string::string(local_78,in_RCX);
  addcontents<char_const*,std::__cxx11::string,unsigned_int>
            (in_stack_000000a0,in_stack_00000098,(char *)this,f,head._4_4_);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

TrodesMsg(std::string f, H head, T... tail) : TrodesMsg(){
        addcontents(f, head, tail...);
    }